

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::ComputePDBOutputDir
          (cmGeneratorTarget *this,string *kind,string *config,string *out)

{
  cmLocalGenerator *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  pointer pcVar6;
  string *psVar7;
  cmGlobalGenerator *pcVar8;
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [32];
  string local_1f8;
  undefined4 local_1d4;
  string local_1d0;
  undefined1 local_1b0 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  cge_1;
  undefined1 local_190 [8];
  cmGeneratorExpression ge_1;
  string local_178;
  char *local_158;
  char *outdir;
  undefined1 local_130 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_110 [8];
  cmGeneratorExpression ge;
  string local_f8;
  char *local_d8;
  char *config_outdir;
  string configPropStr;
  char *configProp;
  string configUpper;
  string conf;
  string local_58 [8];
  string propertyNameStr;
  char *propertyName;
  string *out_local;
  string *config_local;
  string *kind_local;
  cmGeneratorTarget *this_local;
  
  propertyNameStr.field_2._8_8_ = 0;
  std::__cxx11::string::string(local_58,(string *)kind);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::operator+=(local_58,"_OUTPUT_DIRECTORY");
    propertyNameStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  std::__cxx11::string::string((string *)(configUpper.field_2._M_local_buf + 8),(string *)config);
  cmsys::SystemTools::UpperCase((string *)&configProp,(string *)((long)&configUpper.field_2 + 8));
  configPropStr.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&config_outdir,(string *)kind);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&config_outdir,"_OUTPUT_DIRECTORY_");
    std::__cxx11::string::operator+=((string *)&config_outdir,(string *)&configProp);
    configPropStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  uVar2 = configPropStr.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,(char *)uVar2,
             (allocator<char> *)
             ((long)&ge.Backtrace.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  pcVar5 = GetProperty(this,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ge.Backtrace.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  uVar2 = propertyNameStr.field_2._8_8_;
  local_d8 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,(char *)uVar2,
               (allocator<char> *)
               ((long)&ge_1.Backtrace.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    pcVar5 = GetProperty(this,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ge_1.Backtrace.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    local_158 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      cge_1._M_t.
      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
            )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              )0x0;
      cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge_1);
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)local_190,(cmListFileBacktrace *)&cge_1);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge_1);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_1b0,local_190);
      pcVar6 = std::
               unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                             *)local_1b0);
      pcVar1 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&local_1d0);
      psVar7 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar6,pcVar1,config,false,(cmGeneratorTarget *)0x0,
                          (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_1d0
                         );
      std::__cxx11::string::operator=((string *)out,(string *)psVar7);
      std::__cxx11::string::~string((string *)&local_1d0);
      bVar3 = std::operator!=(out,local_158);
      if (bVar3) {
        std::__cxx11::string::clear();
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)local_1b0);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_190);
    }
  }
  else {
    cge._M_t.
    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            )0x0;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_110,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_130,local_110);
    pcVar6 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_130);
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&outdir);
    psVar7 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar6,pcVar1,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0
                        ,(cmGeneratorExpressionDAGChecker *)0x0,(string *)&outdir);
    std::__cxx11::string::operator=((string *)out,(string *)psVar7);
    std::__cxx11::string::~string((string *)&outdir);
    std::__cxx11::string::clear();
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_130);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_110);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath(&local_1f8,out,psVar7);
    std::__cxx11::string::operator=((string *)out,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pcVar8 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_218,"/",&local_219);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_240,"",&local_241);
      (*pcVar8->_vptr_cmGlobalGenerator[0x16])
                (pcVar8,local_218,(undefined1 *)((long)&configUpper.field_2 + 8),local_240,out);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator(&local_241);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator(&local_219);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  local_1d4 = 1;
  std::__cxx11::string::~string((string *)&config_outdir);
  std::__cxx11::string::~string((string *)&configProp);
  std::__cxx11::string::~string((string *)(configUpper.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_58);
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::ComputePDBOutputDir(const std::string& kind,
                                            const std::string& config,
                                            std::string& out) const
{
  // Look for a target property defining the target output directory
  // based on the target type.
  const char* propertyName = nullptr;
  std::string propertyNameStr = kind;
  if (!propertyNameStr.empty()) {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
  }
  std::string conf = config;

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = nullptr;
  std::string configPropStr = kind;
  if (!configPropStr.empty()) {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
  }

  // Select an output directory.
  if (const char* config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (const char* outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir) {
      conf.clear();
    }
  }
  if (out.empty()) {
    return false;
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, "", out);
  }
  return true;
}